

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Archiver_GL.cpp
# Opt level: O2

IShader * __thiscall
Diligent::anon_unknown_1::CompiledShaderGL::GetDeviceShader(CompiledShaderGL *this)

{
  if (((this->m_pShaderGL).m_pObject == (IShader *)0x0) &&
     ((this->m_Status)._M_i == SHADER_STATUS_READY)) {
    CreateGLShader(this);
  }
  return (this->m_pShaderGL).m_pObject;
}

Assistant:

virtual IShader* GetDeviceShader() override final
    {
        if (m_pShaderGL == nullptr)
        {
            if (m_Status.load() == SHADER_STATUS_READY)
            {
                try
                {
                    CreateGLShader();
                }
                catch (...)
                {
                    m_Status.store(SHADER_STATUS_FAILED);
                }
            }
        }
        return m_pShaderGL;
    }